

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O2

QString * __thiscall QLibrary::fileName(QString *__return_storage_ptr__,QLibrary *this)

{
  ulong uVar1;
  long lVar2;
  long in_FS_OFFSET;
  undefined1 local_30 [16];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = (this->d).d;
  if (uVar1 < 8) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    local_30._0_8_ = (uVar1 & 0xfffffffffffffff8) + 0x40;
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QBasicMutex::lock((QBasicMutex *)local_30._0_8_);
    local_30[8] = true;
    uVar1 = (this->d).d & 0xfffffffffffffff8;
    lVar2 = 0x88;
    if (*(long *)(uVar1 + 0x98) == 0) {
      lVar2 = 0;
    }
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)(lVar2 + uVar1));
    QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_30);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QLibrary::fileName() const
{
    if (d) {
        QMutexLocker locker(&d->mutex);
        return d->qualifiedFileName.isEmpty() ? d->fileName : d->qualifiedFileName;
    }
    return QString();
}